

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O0

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionInfo *inlinee,bool isInlined)

{
  code *pcVar1;
  ushort uVar2;
  bool bVar3;
  ProfileId PVar4;
  Type TVar5;
  undefined4 *puVar6;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> **ppWVar7;
  Recycler *pRVar8;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *ptr;
  FunctionCodeGenJitTimeData **ppFVar9;
  FunctionCodeGenJitTimeData *local_78;
  FunctionCodeGenJitTimeData *inlineeData;
  TrackAllocData local_60;
  FunctionBody *local_38;
  FunctionBody *functionBody;
  FunctionInfo *pFStack_28;
  bool isInlined_local;
  FunctionInfo *inlinee_local;
  Recycler *pRStack_18;
  ProfileId profiledCallSiteId_local;
  Recycler *recycler_local;
  FunctionCodeGenJitTimeData *this_local;
  
  functionBody._7_1_ = isInlined;
  pFStack_28 = inlinee;
  inlinee_local._6_2_ = profiledCallSiteId;
  pRStack_18 = recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x81,"(recycler)","recycler");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_38 = GetFunctionBody(this);
  if (local_38 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x83,"(functionBody)","functionBody");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar2 = inlinee_local._6_2_;
  PVar4 = FunctionBody::GetProfiledCallSiteCount(local_38);
  if (PVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x84,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (pFStack_28 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x85,"(inlinee)","inlinee");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->inlinees);
  pRVar8 = pRStack_18;
  if (*ppWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    PVar4 = FunctionBody::GetProfiledCallSiteCount(local_38);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,
               (type_info *)&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo,0,
               (ulong)PVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
               ,0x89);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_60);
    PVar4 = FunctionBody::GetProfiledCallSiteCount(local_38);
    ptr = Memory::
          AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>,false>
                    ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)PVar4);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::operator=
              (&this->inlinees,ptr);
  }
  ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->inlinees);
  ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenJitTimeData__
                      ((WriteBarrierPtr *)(*ppWVar7 + inlinee_local._6_2_));
  if (*ppFVar9 == (FunctionCodeGenJitTimeData *)0x0) {
    local_78 = New(pRStack_18,pFStack_28,(EntryPointInfo *)0x0,(bool)(functionBody._7_1_ & 1));
    ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->inlinees);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::operator=
              (*ppWVar7 + inlinee_local._6_2_,local_78);
    TVar5 = this->inlineeCount + 1;
    this->inlineeCount = TVar5;
    if (TVar5 == 0) {
      Throw::OutOfMemory();
    }
  }
  else {
    local_78 = New(pRStack_18,pFStack_28,(EntryPointInfo *)0x0,(bool)(functionBody._7_1_ & 1));
    ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->inlinees);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::operator=
              (&local_78->next,*ppWVar7 + inlinee_local._6_2_);
    ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->inlinees);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::operator=
              (*ppWVar7 + inlinee_local._6_2_,local_78);
  }
  return local_78;
}

Assistant:

FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::AddInlinee(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionInfo *const inlinee,
        bool isInlined)
    {
        Assert(recycler);
        const auto functionBody = GetFunctionBody();
        Assert(functionBody);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee);

        if (!inlinees)
        {
            inlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData *), functionBody->GetProfiledCallSiteCount());
        }

        FunctionCodeGenJitTimeData *inlineeData = nullptr;
        if (!inlinees[profiledCallSiteId])
        {
            inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, isInlined);
            inlinees[profiledCallSiteId] = inlineeData;
            if (++inlineeCount == 0)
            {
                Js::Throw::OutOfMemory();
            }
        }
        else
        {
            inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, isInlined);
            // This is polymorphic, chain the data.
            inlineeData->next = inlinees[profiledCallSiteId];
            inlinees[profiledCallSiteId] = inlineeData;
        }
        return inlineeData;
    }